

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_map.hpp
# Opt level: O3

void __thiscall
cappuccino::
ut_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::do_insert(ut_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
            *this,unsigned_long *key,
           basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
           time_point expire_time)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _List_node_base *p_Var3;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_cappuccino::ut_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::keyed_element>_>,_bool>
  pVar4;
  keyed_element element;
  keyed_element local_50;
  
  paVar2 = &local_50.m_value.field_2;
  local_50.m_value._M_string_length = 0;
  local_50.m_value.field_2._M_local_buf[0] = '\0';
  local_50.m_ttl_position._M_node = (_List_node_base *)0x0;
  local_50.m_value._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::operator=((string *)&local_50,(string *)value);
  pVar4 = std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,cappuccino::ut_map<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::keyed_element>,std::_Select1st<std::pair<unsigned_long_const,cappuccino::ut_map<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::keyed_element>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,cappuccino::ut_map<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::keyed_element>>>
          ::
          _M_emplace_unique<unsigned_long_const&,cappuccino::ut_map<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::keyed_element>
                    ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,cappuccino::ut_map<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::keyed_element>,std::_Select1st<std::pair<unsigned_long_const,cappuccino::ut_map<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::keyed_element>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,cappuccino::ut_map<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::keyed_element>>>
                      *)&this->m_keyed_elements,key,&local_50);
  p_Var3 = (_List_node_base *)operator_new(0x20);
  p_Var3[1]._M_next = (_List_node_base *)expire_time.__d.__r;
  p_Var3[1]._M_prev = (_List_node_base *)pVar4.first._M_node._M_node;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar1 = &(this->m_ttl_list).
            super__List_base<cappuccino::ut_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::ttl_element,_std::allocator<cappuccino::ut_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::ttl_element>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  pVar4.first._M_node._M_node[2]._M_parent =
       (_Base_ptr)
       (this->m_ttl_list).
       super__List_base<cappuccino::ut_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::ttl_element,_std::allocator<cappuccino::ut_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::ttl_element>_>
       ._M_impl._M_node.super__List_node_base._M_prev;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.m_value._M_dataplus._M_p != paVar2) {
    operator_delete(local_50.m_value._M_dataplus._M_p,
                    CONCAT71(local_50.m_value.field_2._M_allocated_capacity._1_7_,
                             local_50.m_value.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

auto do_insert(const key_type& key, value_type&& value, std::chrono::steady_clock::time_point expire_time) -> void
    {
        keyed_element element;
        element.m_value = std::move(value);

        auto keyed_position = m_keyed_elements.emplace(key, std::move(element)).first;

        m_ttl_list.emplace_back(expire_time, keyed_position);

        // Update the elements iterator to ttl_element.
        keyed_position->second.m_ttl_position = std::prev(m_ttl_list.end());
    }